

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

int gauden_compute_euclidean(float64 ***out,uint32 ***w_idx,vector_t *obs,gauden_t *g)

{
  uint uVar1;
  float64 **ppfVar2;
  uint32 **ppuVar3;
  uint32 *puVar4;
  vector_t **pppfVar5;
  float64 *pfVar6;
  uint32 *puVar7;
  vector_t pfVar8;
  vector_t *ppfVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  uint32 uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint32 uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar22;
  ulong uVar23;
  double dVar24;
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar26 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  int iVar32;
  ulong uVar21;
  long lVar30;
  
  auVar12 = _DAT_0011ec90;
  auVar11 = _DAT_0011ec80;
  uVar13 = g->n_mgau;
  if (uVar13 != 0) {
    uVar14 = g->n_feat;
    uVar19 = 0;
    uVar18 = uVar14;
    do {
      if (uVar18 == 0) {
        uVar18 = 0;
      }
      else {
        ppfVar2 = out[uVar19];
        ppuVar3 = w_idx[uVar19];
        puVar4 = g->veclen;
        pppfVar5 = g->mean[uVar19];
        uVar23 = 0;
        do {
          pfVar6 = ppfVar2[uVar23];
          puVar7 = ppuVar3[uVar23];
          uVar13 = g->n_density;
          uVar20 = g->n_top;
          uVar22 = (ulong)uVar20;
          uVar1 = puVar4[uVar23];
          pfVar8 = obs[uVar23];
          ppfVar9 = pppfVar5[uVar23];
          if (uVar22 != 0) {
            lVar30 = uVar22 - 1;
            auVar25._8_4_ = (int)lVar30;
            auVar25._0_8_ = lVar30;
            auVar25._12_4_ = (int)((ulong)lVar30 >> 0x20);
            auVar25 = auVar25 ^ auVar12;
            uVar16 = 0;
            auVar29 = auVar11;
            do {
              auVar31 = auVar29 ^ auVar12;
              bVar10 = auVar25._0_4_ < auVar31._0_4_;
              iVar27 = auVar25._4_4_;
              iVar32 = auVar31._4_4_;
              if ((bool)(~(iVar27 < iVar32 || iVar32 == iVar27 && bVar10) & 1)) {
                *(undefined8 *)((long)pfVar6 + uVar16) = 0x7fb9a2028368022e;
              }
              if (iVar27 >= iVar32 && (iVar32 != iVar27 || !bVar10)) {
                *(undefined8 *)((long)pfVar6 + uVar16 + 8) = 0x7fb9a2028368022e;
              }
              lVar30 = auVar29._8_8_;
              auVar29._0_8_ = auVar29._0_8_ + 2;
              auVar29._8_8_ = lVar30 + 2;
              uVar16 = uVar16 + 0x10;
            } while ((uVar22 * 8 + 8 & 0xfffffffffffffff0) != uVar16);
          }
          if ((ulong)uVar13 != 0) {
            uVar20 = uVar20 - 1;
            uVar21 = (ulong)uVar20;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = pfVar6[uVar21];
            uVar16 = 0;
            do {
              auVar26 = (undefined1  [16])0x0;
              auVar26._0_8_ = 0.0;
              dVar28 = auVar31._0_8_;
              bVar10 = 0.0 < dVar28;
              if (((ulong)uVar1 != 0) && (0.0 < dVar28)) {
                uVar15 = 1;
                do {
                  dVar24 = (double)(pfVar8[uVar15 - 1] - ppfVar9[uVar16][uVar15 - 1]);
                  auVar26._0_8_ = dVar24 * dVar24 + auVar26._0_8_;
                  auVar26._8_8_ = 0;
                  bVar10 = auVar26._0_8_ < dVar28;
                  if (uVar1 <= uVar15) break;
                  uVar15 = uVar15 + 1;
                } while (auVar26._0_8_ < dVar28);
              }
              if (bVar10) {
                uVar15 = 0;
                uVar17 = uVar15;
                if (uVar22 == 0) {
LAB_00113f2f:
                  uVar17 = uVar21;
                  do {
                    pfVar6[uVar17] = pfVar6[uVar17 - 1];
                    puVar7[uVar17] = puVar7[uVar17 - 1];
                    uVar17 = uVar17 - 1;
                  } while ((uVar15 & 0xffffffff) < uVar17);
                }
                else {
                  do {
                    uVar15 = uVar17;
                    if (auVar26._0_8_ < (double)pfVar6[uVar17]) break;
                    uVar17 = uVar17 + 1;
                    uVar15 = uVar22;
                  } while (uVar22 != uVar17);
                  uVar17 = (ulong)uVar20;
                  if ((uint)uVar15 < uVar20) goto LAB_00113f2f;
                }
                if ((int)uVar15 != (int)uVar17) {
                  __assert_fail("j == k",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                ,0x463,
                                "void euclidean_dist(float64 *, uint32 *, uint32, uint32, uint32, vector_t, vector_t *)"
                               );
                }
                pfVar6[uVar15 & 0xffffffff] = (float64)auVar26._0_8_;
                puVar7[uVar15 & 0xffffffff] = (uint32)uVar16;
                auVar31._8_8_ = 0;
                auVar31._0_8_ = pfVar6[uVar21];
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar13);
            uVar14 = g->n_feat;
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 < uVar14);
        uVar13 = g->n_mgau;
        uVar18 = uVar14;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < uVar13);
  }
  return 0;
}

Assistant:

int
gauden_compute_euclidean(float64 ***out,
			 uint32 ***w_idx,
			 vector_t *obs,
			 gauden_t *g)
{
    uint32 i, j;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {

	    euclidean_dist(out[i][j],
			   w_idx[i][j],
			   g->n_top,
			   g->n_density,
			   g->veclen[j],
			   obs[j],
			   g->mean[i][j]);
	    
#ifdef GAUDEN_VERBOSE
	    gauden_print(stdout,
			 out, w_idx, g,
			 NULL, 0);
#endif
	}
    }

    return S3_SUCCESS;
}